

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferedRegionProfile.cpp
# Opt level: O3

void __thiscall cali::BufferedRegionProfile::BufferedRegionProfile(BufferedRegionProfile *this)

{
  BufferedRegionProfileImpl *__p;
  _Rb_tree_header *p_Var1;
  
  RegionProfile::RegionProfile(&this->super_RegionProfile);
  (this->super_RegionProfile).super_ChannelController._vptr_ChannelController =
       (_func_int **)&PTR_on_create_00276c80;
  __p = (BufferedRegionProfileImpl *)operator_new(0x40);
  p_Var1 = &(__p->reg_times)._M_t._M_impl.super__Rb_tree_header;
  (__p->reg_times)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__p->reg_times)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__p->reg_times)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (__p->reg_times)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (__p->reg_times)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->mP).
  super___shared_ptr<cali::BufferedRegionProfile::BufferedRegionProfileImpl,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cali::BufferedRegionProfile::BufferedRegionProfileImpl*>
            (&(this->mP).
              super___shared_ptr<cali::BufferedRegionProfile::BufferedRegionProfileImpl,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,__p);
  return;
}

Assistant:

BufferedRegionProfile::BufferedRegionProfile() : RegionProfile(), mP { new BufferedRegionProfileImpl }
{}